

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O3

idx_t duckdb::TemplatedMatch<true,duckdb::hugeint_t,duckdb::GreaterThan>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  data_ptr_t pdVar1;
  SelectionVector *pSVar2;
  data_ptr_t pdVar3;
  value_type vVar4;
  sel_t *psVar5;
  sel_t *psVar6;
  unsigned_long *puVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  const_reference pvVar11;
  idx_t iVar12;
  idx_t iVar13;
  idx_t iVar14;
  idx_t iVar15;
  idx_t iVar16;
  hugeint_t *lhs_data;
  bool bVar17;
  
  if ((lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    pSVar2 = (lhs_format->unified).sel;
    pdVar1 = (lhs_format->unified).data;
    pdVar3 = rhs_row_locations->data;
    pvVar11 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar4 = *pvVar11;
      iVar13 = *no_match_count;
      psVar5 = sel->sel_vector;
      psVar6 = pSVar2->sel_vector;
      iVar12 = 0;
      iVar14 = 0;
      do {
        iVar15 = iVar14;
        if (psVar5 != (sel_t *)0x0) {
          iVar15 = (idx_t)psVar5[iVar14];
        }
        iVar16 = iVar15;
        if (psVar6 != (sel_t *)0x0) {
          iVar16 = (idx_t)psVar6[iVar15];
        }
        lVar8 = *(long *)(pdVar3 + iVar15 * 8);
        if ((1 << ((byte)col_idx & 7) & (uint)*(byte *)(lVar8 + (col_idx >> 3))) == 0) {
LAB_015b1cba:
          *no_match_count = iVar13 + 1;
          no_match_sel->sel_vector[iVar13] = (sel_t)iVar15;
          iVar13 = iVar13 + 1;
        }
        else {
          lVar9 = *(long *)(pdVar1 + iVar16 * 0x10 + 8);
          lVar10 = *(long *)(lVar8 + 8 + vVar4);
          if ((lVar9 <= lVar10) &&
             (*(ulong *)(pdVar1 + iVar16 * 0x10) <= *(ulong *)(lVar8 + vVar4) || lVar9 != lVar10))
          goto LAB_015b1cba;
          psVar5[iVar12] = (sel_t)iVar15;
          iVar12 = iVar12 + 1;
        }
        iVar14 = iVar14 + 1;
        if (count == iVar14) {
          return iVar12;
        }
      } while( true );
    }
  }
  else {
    pdVar1 = rhs_row_locations->data;
    pSVar2 = (lhs_format->unified).sel;
    pdVar3 = (lhs_format->unified).data;
    pvVar11 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar4 = *pvVar11;
      iVar13 = *no_match_count;
      psVar5 = sel->sel_vector;
      psVar6 = pSVar2->sel_vector;
      puVar7 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
               validity_mask;
      iVar12 = 0;
      iVar14 = 0;
      do {
        iVar15 = iVar14;
        if (psVar5 != (sel_t *)0x0) {
          iVar15 = (idx_t)psVar5[iVar14];
        }
        iVar16 = iVar15;
        if (psVar6 != (sel_t *)0x0) {
          iVar16 = (idx_t)psVar6[iVar15];
        }
        if (puVar7 == (unsigned_long *)0x0) {
          bVar17 = false;
        }
        else {
          bVar17 = (puVar7[iVar16 >> 6] >> (iVar16 & 0x3f) & 1) == 0;
        }
        if ((bVar17) ||
           (lVar8 = *(long *)(pdVar1 + iVar15 * 8),
           ((uint)*(byte *)(lVar8 + (col_idx >> 3)) & 1 << ((byte)col_idx & 7)) == 0)) {
LAB_015b1be5:
          *no_match_count = iVar13 + 1;
          no_match_sel->sel_vector[iVar13] = (sel_t)iVar15;
          iVar13 = iVar13 + 1;
        }
        else {
          lVar9 = *(long *)(pdVar3 + iVar16 * 0x10 + 8);
          lVar10 = *(long *)(lVar8 + 8 + vVar4);
          if ((lVar9 <= lVar10) &&
             (*(ulong *)(pdVar3 + iVar16 * 0x10) <= *(ulong *)(lVar8 + vVar4) || lVar9 != lVar10))
          goto LAB_015b1be5;
          psVar5[iVar12] = (sel_t)iVar15;
          iVar12 = iVar12 + 1;
        }
        iVar14 = iVar14 + 1;
        if (count == iVar14) {
          return iVar12;
        }
      } while( true );
    }
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}